

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto(void)

{
  Descriptor *pDVar1;
  long lVar2;
  Message *pMVar3;
  DescriptorPool *pDVar4;
  FileDescriptor *pFVar5;
  LogMessage *other;
  GeneratedMessageReflection *pGVar6;
  MessageFactory *pMVar7;
  allocator<char> local_61;
  LogMessage local_60;
  
  protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
  pDVar4 = DescriptorPool::generated_pool();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"google/protobuf/descriptor.proto",&local_61);
  pFVar5 = DescriptorPool::FindFileByName(pDVar4,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pFVar5 == (FileDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x61);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: file != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pDVar1 = *(Descriptor **)(pFVar5 + 0x50);
  (anonymous_namespace)::FileDescriptorSet_descriptor_ = pDVar1;
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = FileDescriptorSet::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,pDVar1,pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::FileDescriptorSet_offsets_,
             0x2c,8,-1,pDVar4,pMVar7,0x30);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::FileDescriptorSet_reflection_ = pGVar6;
  (anonymous_namespace)::FileDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0x78);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = FileDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x78),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             FileDescriptorProto_offsets_,0xcc,8,-1,pDVar4,pMVar7,0xd0);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::FileDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::DescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0xf0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = DescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0xf0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::DescriptorProto_offsets_,
             0x9c,8,-1,pDVar4,pMVar7,0xa0);
  pDVar1 = *(Descriptor **)((anonymous_namespace)::DescriptorProto_descriptor_ + 0x40);
  (anonymous_namespace)::DescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::DescriptorProto_ExtensionRange_descriptor_ = pDVar1;
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = DescriptorProto_ExtensionRange::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,pDVar1,pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             DescriptorProto_ExtensionRange_offsets_,0x1c,8,-1,pDVar4,pMVar7,0x20);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::DescriptorProto_ExtensionRange_reflection_ = pGVar6;
  (anonymous_namespace)::FieldDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0x168);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = FieldDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x168),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             FieldDescriptorProto_offsets_,0x48,8,-1,pDVar4,pMVar7,0x50);
  (anonymous_namespace)::FieldDescriptorProto_Type_descriptor_ =
       *(long *)((anonymous_namespace)::FieldDescriptorProto_descriptor_ + 0x50);
  (anonymous_namespace)::FieldDescriptorProto_Label_descriptor_ =
       (anonymous_namespace)::FieldDescriptorProto_Type_descriptor_ + 0x38;
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::FieldDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::EnumDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0x1e0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = EnumDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x1e0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             EnumDescriptorProto_offsets_,0x3c,8,-1,pDVar4,pMVar7,0x40);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::EnumDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::EnumValueDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 600);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = EnumValueDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 600),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             EnumValueDescriptorProto_offsets_,0x28,8,-1,pDVar4,pMVar7,0x30);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::EnumValueDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::ServiceDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0x2d0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = ServiceDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x2d0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             ServiceDescriptorProto_offsets_,0x3c,8,-1,pDVar4,pMVar7,0x40);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::ServiceDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::MethodDescriptorProto_descriptor_ = (Descriptor *)(lVar2 + 0x348);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = MethodDescriptorProto::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x348),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             MethodDescriptorProto_offsets_,0x34,8,-1,pDVar4,pMVar7,0x38);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::MethodDescriptorProto_reflection_ = pGVar6;
  (anonymous_namespace)::FileOptions_descriptor_ = (Descriptor *)(lVar2 + 0x3c0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = FileOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x3c0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::FileOptions_offsets_,0x80,
             0x38,8,pDVar4,pMVar7,0x88);
  (anonymous_namespace)::FileOptions_OptimizeMode_descriptor_ =
       *(undefined8 *)((anonymous_namespace)::FileOptions_descriptor_ + 0x50);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::FileOptions_reflection_ = pGVar6;
  (anonymous_namespace)::MessageOptions_descriptor_ = (Descriptor *)(lVar2 + 0x438);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = MessageOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x438),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::MessageOptions_offsets_,
             0x60,0x38,8,pDVar4,pMVar7,0x68);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::MessageOptions_reflection_ = pGVar6;
  (anonymous_namespace)::FieldOptions_descriptor_ = (Descriptor *)(lVar2 + 0x4b0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = FieldOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x4b0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::FieldOptions_offsets_,0x6c,
             0x38,8,pDVar4,pMVar7,0x70);
  (anonymous_namespace)::FieldOptions_CType_descriptor_ =
       *(undefined8 *)((anonymous_namespace)::FieldOptions_descriptor_ + 0x50);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::FieldOptions_reflection_ = pGVar6;
  (anonymous_namespace)::EnumOptions_descriptor_ = (Descriptor *)(lVar2 + 0x528);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = EnumOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x528),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::EnumOptions_offsets_,0x60,
             0x38,8,pDVar4,pMVar7,0x68);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::EnumOptions_reflection_ = pGVar6;
  (anonymous_namespace)::EnumValueOptions_descriptor_ = (Descriptor *)(lVar2 + 0x5a0);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = EnumValueOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x5a0),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::EnumValueOptions_offsets_,
             0x5c,0x38,8,pDVar4,pMVar7,0x60);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::EnumValueOptions_reflection_ = pGVar6;
  (anonymous_namespace)::ServiceOptions_descriptor_ = (Descriptor *)(lVar2 + 0x618);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = ServiceOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x618),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::ServiceOptions_offsets_,
             0x5c,0x38,8,pDVar4,pMVar7,0x60);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::ServiceOptions_reflection_ = pGVar6;
  (anonymous_namespace)::MethodOptions_descriptor_ = (Descriptor *)(lVar2 + 0x690);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = MethodOptions::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x690),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::MethodOptions_offsets_,0x5c
             ,0x38,8,pDVar4,pMVar7,0x60);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::MethodOptions_reflection_ = pGVar6;
  (anonymous_namespace)::UninterpretedOption_descriptor_ = (Descriptor *)(lVar2 + 0x708);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = UninterpretedOption::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x708),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             UninterpretedOption_offsets_,0x5c,8,-1,pDVar4,pMVar7,0x60);
  pDVar1 = *(Descriptor **)((anonymous_namespace)::UninterpretedOption_descriptor_ + 0x40);
  (anonymous_namespace)::UninterpretedOption_reflection_ = pGVar6;
  (anonymous_namespace)::UninterpretedOption_NamePart_descriptor_ = pDVar1;
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = UninterpretedOption_NamePart::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,pDVar1,pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             UninterpretedOption_NamePart_offsets_,0x20,8,-1,pDVar4,pMVar7,0x28);
  lVar2 = *(long *)(pFVar5 + 0x50);
  (anonymous_namespace)::UninterpretedOption_NamePart_reflection_ = pGVar6;
  (anonymous_namespace)::SourceCodeInfo_descriptor_ = (Descriptor *)(lVar2 + 0x780);
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = SourceCodeInfo::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,(Descriptor *)(lVar2 + 0x780),pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::SourceCodeInfo_offsets_,
             0x2c,8,-1,pDVar4,pMVar7,0x30);
  pDVar1 = *(Descriptor **)((anonymous_namespace)::SourceCodeInfo_descriptor_ + 0x40);
  (anonymous_namespace)::SourceCodeInfo_reflection_ = pGVar6;
  (anonymous_namespace)::SourceCodeInfo_Location_descriptor_ = pDVar1;
  pGVar6 = (GeneratedMessageReflection *)operator_new(0x40);
  pMVar3 = SourceCodeInfo_Location::default_instance_;
  pDVar4 = DescriptorPool::generated_pool();
  pMVar7 = MessageFactory::generated_factory();
  internal::GeneratedMessageReflection::GeneratedMessageReflection
            (pGVar6,pDVar1,pMVar3,
             protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto::
             SourceCodeInfo_Location_offsets_,0x54,8,-1,pDVar4,pMVar7,0x58);
  (anonymous_namespace)::SourceCodeInfo_Location_reflection_ = pGVar6;
  return;
}

Assistant:

void protobuf_AssignDesc_google_2fprotobuf_2fdescriptor_2eproto() {
  protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
  const ::google::protobuf::FileDescriptor* file =
    ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(
      "google/protobuf/descriptor.proto");
  GOOGLE_CHECK(file != NULL);
  FileDescriptorSet_descriptor_ = file->message_type(0);
  static const int FileDescriptorSet_offsets_[1] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorSet, file_),
  };
  FileDescriptorSet_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      FileDescriptorSet_descriptor_,
      FileDescriptorSet::default_instance_,
      FileDescriptorSet_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorSet, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorSet, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(FileDescriptorSet));
  FileDescriptorProto_descriptor_ = file->message_type(1);
  static const int FileDescriptorProto_offsets_[11] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, package_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, dependency_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, public_dependency_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, weak_dependency_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, message_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, enum_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, service_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, extension_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, options_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, source_code_info_),
  };
  FileDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      FileDescriptorProto_descriptor_,
      FileDescriptorProto::default_instance_,
      FileDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(FileDescriptorProto));
  DescriptorProto_descriptor_ = file->message_type(2);
  static const int DescriptorProto_offsets_[7] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, field_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, extension_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, nested_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, enum_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, extension_range_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, options_),
  };
  DescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      DescriptorProto_descriptor_,
      DescriptorProto::default_instance_,
      DescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(DescriptorProto));
  DescriptorProto_ExtensionRange_descriptor_ = DescriptorProto_descriptor_->nested_type(0);
  static const int DescriptorProto_ExtensionRange_offsets_[2] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto_ExtensionRange, start_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto_ExtensionRange, end_),
  };
  DescriptorProto_ExtensionRange_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      DescriptorProto_ExtensionRange_descriptor_,
      DescriptorProto_ExtensionRange::default_instance_,
      DescriptorProto_ExtensionRange_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto_ExtensionRange, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(DescriptorProto_ExtensionRange, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(DescriptorProto_ExtensionRange));
  FieldDescriptorProto_descriptor_ = file->message_type(3);
  static const int FieldDescriptorProto_offsets_[8] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, number_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, label_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, type_name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, extendee_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, default_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, options_),
  };
  FieldDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      FieldDescriptorProto_descriptor_,
      FieldDescriptorProto::default_instance_,
      FieldDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(FieldDescriptorProto));
  FieldDescriptorProto_Type_descriptor_ = FieldDescriptorProto_descriptor_->enum_type(0);
  FieldDescriptorProto_Label_descriptor_ = FieldDescriptorProto_descriptor_->enum_type(1);
  EnumDescriptorProto_descriptor_ = file->message_type(4);
  static const int EnumDescriptorProto_offsets_[3] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumDescriptorProto, value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumDescriptorProto, options_),
  };
  EnumDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      EnumDescriptorProto_descriptor_,
      EnumDescriptorProto::default_instance_,
      EnumDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(EnumDescriptorProto));
  EnumValueDescriptorProto_descriptor_ = file->message_type(5);
  static const int EnumValueDescriptorProto_offsets_[3] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueDescriptorProto, number_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueDescriptorProto, options_),
  };
  EnumValueDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      EnumValueDescriptorProto_descriptor_,
      EnumValueDescriptorProto::default_instance_,
      EnumValueDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(EnumValueDescriptorProto));
  ServiceDescriptorProto_descriptor_ = file->message_type(6);
  static const int ServiceDescriptorProto_offsets_[3] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceDescriptorProto, method_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceDescriptorProto, options_),
  };
  ServiceDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      ServiceDescriptorProto_descriptor_,
      ServiceDescriptorProto::default_instance_,
      ServiceDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(ServiceDescriptorProto));
  MethodDescriptorProto_descriptor_ = file->message_type(7);
  static const int MethodDescriptorProto_offsets_[4] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, input_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, output_type_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, options_),
  };
  MethodDescriptorProto_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      MethodDescriptorProto_descriptor_,
      MethodDescriptorProto::default_instance_,
      MethodDescriptorProto_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodDescriptorProto, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(MethodDescriptorProto));
  FileOptions_descriptor_ = file->message_type(8);
  static const int FileOptions_offsets_[10] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, java_package_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, java_outer_classname_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, java_multiple_files_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, java_generate_equals_and_hash_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, optimize_for_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, go_package_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, cc_generic_services_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, java_generic_services_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, py_generic_services_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, uninterpreted_option_),
  };
  FileOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      FileOptions_descriptor_,
      FileOptions::default_instance_,
      FileOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FileOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(FileOptions));
  FileOptions_OptimizeMode_descriptor_ = FileOptions_descriptor_->enum_type(0);
  MessageOptions_descriptor_ = file->message_type(9);
  static const int MessageOptions_offsets_[3] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, message_set_wire_format_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, no_standard_descriptor_accessor_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, uninterpreted_option_),
  };
  MessageOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      MessageOptions_descriptor_,
      MessageOptions::default_instance_,
      MessageOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MessageOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(MessageOptions));
  FieldOptions_descriptor_ = file->message_type(10);
  static const int FieldOptions_offsets_[7] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, ctype_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, packed_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, lazy_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, deprecated_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, experimental_map_key_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, weak_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, uninterpreted_option_),
  };
  FieldOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      FieldOptions_descriptor_,
      FieldOptions::default_instance_,
      FieldOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(FieldOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(FieldOptions));
  FieldOptions_CType_descriptor_ = FieldOptions_descriptor_->enum_type(0);
  EnumOptions_descriptor_ = file->message_type(11);
  static const int EnumOptions_offsets_[2] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumOptions, allow_alias_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumOptions, uninterpreted_option_),
  };
  EnumOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      EnumOptions_descriptor_,
      EnumOptions::default_instance_,
      EnumOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(EnumOptions));
  EnumValueOptions_descriptor_ = file->message_type(12);
  static const int EnumValueOptions_offsets_[1] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueOptions, uninterpreted_option_),
  };
  EnumValueOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      EnumValueOptions_descriptor_,
      EnumValueOptions::default_instance_,
      EnumValueOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(EnumValueOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(EnumValueOptions));
  ServiceOptions_descriptor_ = file->message_type(13);
  static const int ServiceOptions_offsets_[1] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceOptions, uninterpreted_option_),
  };
  ServiceOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      ServiceOptions_descriptor_,
      ServiceOptions::default_instance_,
      ServiceOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(ServiceOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(ServiceOptions));
  MethodOptions_descriptor_ = file->message_type(14);
  static const int MethodOptions_offsets_[1] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodOptions, uninterpreted_option_),
  };
  MethodOptions_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      MethodOptions_descriptor_,
      MethodOptions::default_instance_,
      MethodOptions_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodOptions, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodOptions, _unknown_fields_),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(MethodOptions, _extensions_),
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(MethodOptions));
  UninterpretedOption_descriptor_ = file->message_type(15);
  static const int UninterpretedOption_offsets_[7] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, name_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, identifier_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, positive_int_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, negative_int_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, double_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, string_value_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, aggregate_value_),
  };
  UninterpretedOption_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      UninterpretedOption_descriptor_,
      UninterpretedOption::default_instance_,
      UninterpretedOption_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(UninterpretedOption));
  UninterpretedOption_NamePart_descriptor_ = UninterpretedOption_descriptor_->nested_type(0);
  static const int UninterpretedOption_NamePart_offsets_[2] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption_NamePart, name_part_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption_NamePart, is_extension_),
  };
  UninterpretedOption_NamePart_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      UninterpretedOption_NamePart_descriptor_,
      UninterpretedOption_NamePart::default_instance_,
      UninterpretedOption_NamePart_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption_NamePart, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(UninterpretedOption_NamePart, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(UninterpretedOption_NamePart));
  SourceCodeInfo_descriptor_ = file->message_type(16);
  static const int SourceCodeInfo_offsets_[1] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo, location_),
  };
  SourceCodeInfo_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      SourceCodeInfo_descriptor_,
      SourceCodeInfo::default_instance_,
      SourceCodeInfo_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(SourceCodeInfo));
  SourceCodeInfo_Location_descriptor_ = SourceCodeInfo_descriptor_->nested_type(0);
  static const int SourceCodeInfo_Location_offsets_[4] = {
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, path_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, span_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, leading_comments_),
    GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, trailing_comments_),
  };
  SourceCodeInfo_Location_reflection_ =
    new ::google::protobuf::internal::GeneratedMessageReflection(
      SourceCodeInfo_Location_descriptor_,
      SourceCodeInfo_Location::default_instance_,
      SourceCodeInfo_Location_offsets_,
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, _has_bits_[0]),
      GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET(SourceCodeInfo_Location, _unknown_fields_),
      -1,
      ::google::protobuf::DescriptorPool::generated_pool(),
      ::google::protobuf::MessageFactory::generated_factory(),
      sizeof(SourceCodeInfo_Location));
}